

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O0

int nni_id_set(nni_id_map *m,uint64_t id,void *val)

{
  int iVar1;
  size_t sVar2;
  nni_id_entry *pnVar3;
  nni_id_entry *ent;
  size_t index;
  void *val_local;
  uint64_t id_local;
  nni_id_map *m_local;
  
  iVar1 = id_resize(m);
  if (iVar1 == 0) {
    sVar2 = id_find(m,id);
    if (sVar2 == 0xffffffffffffffff) {
      ent = (nni_id_entry *)(id & m->id_cap - 1);
      while( true ) {
        pnVar3 = m->id_entries + (long)ent;
        m->id_load = m->id_load + 1;
        if (pnVar3->val == (void *)0x0) break;
        pnVar3->skips = pnVar3->skips + 1;
        ent = (nni_id_entry *)((long)ent * 5 + 1U & (ulong)(m->id_cap - 1));
      }
      m->id_count = m->id_count + 1;
      pnVar3->key = id;
      pnVar3->val = val;
      m_local._4_4_ = 0;
    }
    else {
      m->id_entries[sVar2].val = val;
      m_local._4_4_ = 0;
    }
  }
  else {
    m_local._4_4_ = 2;
  }
  return m_local._4_4_;
}

Assistant:

int
nni_id_set(nni_id_map *m, uint64_t id, void *val)
{
	size_t        index;
	nni_id_entry *ent;

	// Try to resize -- if we don't need to, this will be a no-op.
	if (id_resize(m) != 0) {
		return (NNG_ENOMEM);
	}

	// If it already exists, just overwrite the old value.
	if ((index = id_find(m, id)) != (size_t) -1) {
		ent      = &m->id_entries[index];
		ent->val = val;
		return (0);
	}

	index = ID_INDEX(m, id);
	for (;;) {
		ent = &m->id_entries[index];

		// Increment the load count.  We do this each time time we
		// rehash.  This may over-count items that collide on the
		// same rehashing, but this should just cause a table to
		// grow sooner, which is probably a good thing.
		m->id_load++;
		if (ent->val == NULL) {
			m->id_count++;
			ent->key = id;
			ent->val = val;
			return (0);
		}
		// Record the skip count.  This being non-zero informs
		// that a rehash will be necessary.  Without this we
		// would need to scan the entire hash for the match.
		ent->skips++;
		index = ID_NEXT(m, index);
	}
}